

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

JitProfilingInstr *
IR::JitProfilingInstr::New(OpCode opcode,Opnd *dstOpnd,Opnd *src1Opnd,Func *func)

{
  undefined1 *puVar1;
  Func *func_00;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  JitProfilingInstr *this;
  
  bVar3 = Func::DoSimpleJitDynamicProfile(func);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x307,"(func->DoSimpleJitDynamicProfile())",
                       "func->DoSimpleJitDynamicProfile()");
    if (!bVar3) goto LAB_004bb73e;
    *puVar5 = 0;
  }
  this = (JitProfilingInstr *)new<Memory::JitArenaAllocator>(0x68,func->m_alloc,0x3f1274);
  (this->super_Instr)._vptr_Instr = (_func_int **)0x0;
  (this->super_Instr).m_noLazyHelperAssert = false;
  *(undefined3 *)&(this->super_Instr).field_0x9 = 0;
  (this->super_Instr).bailOutByteCodeLocation = 0;
  (this->super_Instr).m_opcode = EndOfBlock;
  (this->super_Instr).ignoreOverflowBitCount = '\0';
  (this->super_Instr).dataWidth = '\0';
  (this->super_Instr).highlight = 0;
  *(undefined2 *)&(this->super_Instr).field_0x36 = 0;
  *(undefined8 *)&(this->super_Instr).field_0x38 = 0;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  this->profileId = 0;
  this->arrayProfileId = 0;
  this->field_2 = (anon_union_4_2_bef1c525_for_JitProfilingInstr_3)0x0;
  (this->super_Instr).m_next = (Instr *)0x0;
  (this->super_Instr).m_prev = (Instr *)0x0;
  (this->super_Instr).m_func = (Func *)0x0;
  (this->super_Instr).globOptInstrString = (char16 *)0x0;
  *(undefined8 *)&this->field_0x60 = 0;
  (this->super_Instr).m_dst = (Opnd *)0x0;
  (this->super_Instr).m_src1 = (Opnd *)0x0;
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_014ea730;
  (this->super_Instr).m_noLazyHelperAssert = false;
  (this->super_Instr).m_opcode = MaxByteSizedOpcodes;
  (this->super_Instr).ignoreOverflowBitCount = ' ';
  (this->super_Instr).highlight = 0;
  puVar1 = &(this->super_Instr).field_0x36;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 1;
  puVar1 = &(this->super_Instr).field_0x38;
  *puVar1 = *puVar1 & 0x80;
  (this->super_Instr).m_number = 0xffffffff;
  (this->super_Instr).m_src2 = (Opnd *)0x0;
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_014ea880;
  Instr::Init((Instr *)this,opcode,InstrKindJitProfiling,func);
  if (dstOpnd != (Opnd *)0x0) {
    Instr::SetDst((Instr *)this,dstOpnd);
  }
  if (src1Opnd != (Opnd *)0x0) {
    if ((this->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004bb73e;
      *puVar5 = 0;
    }
    func_00 = (this->super_Instr).m_func;
    if (src1Opnd->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_004bb73e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    bVar4 = src1Opnd->field_0xb;
    if ((bVar4 & 2) != 0) {
      src1Opnd = Opnd::Copy(src1Opnd,func_00);
      bVar4 = src1Opnd->field_0xb;
    }
    src1Opnd->field_0xb = bVar4 | 2;
    (this->super_Instr).m_src1 = src1Opnd;
  }
  this->profileId = 0xffff;
  this->arrayProfileId = 0xffff;
  this->field_2 = (anon_union_4_2_bef1c525_for_JitProfilingInstr_3)0xffffffff;
  this->field_0x60 = this->field_0x60 & 0xf0;
  return this;
}

Assistant:

JitProfilingInstr *
JitProfilingInstr::New(Js::OpCode opcode, Opnd *dstOpnd, Opnd *src1Opnd, Func * func)
{
    Assert(func->DoSimpleJitDynamicProfile());

    JitProfilingInstr * profiledInstr = JitAnew(func->m_alloc, IR::JitProfilingInstr);
    profiledInstr->Init(opcode, InstrKindJitProfiling, func);

    if (dstOpnd)
    {
        profiledInstr->SetDst(dstOpnd);
    }
    if (src1Opnd)
    {
        profiledInstr->SetSrc1(src1Opnd);
    }

#if DBG
    profiledInstr->profileId = Js::Constants::NoProfileId;
    profiledInstr->arrayProfileId = Js::Constants::NoProfileId;
    profiledInstr->inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    Assert(profiledInstr->loopNumber == 0u - 1);
#endif

    // default these to false.
    profiledInstr->isProfiledReturnCall = false;
    profiledInstr->isBeginSwitch = false;
    profiledInstr->isNewArray = false;
    profiledInstr->isLoopHelper = false;

    return profiledInstr;
}